

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interrupt.cpp
# Opt level: O2

void __thiscall duckdb::InterruptDoneSignalState::Await(InterruptDoneSignalState *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_28;
  
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->lock);
  while (this->done == false) {
    ::std::condition_variable::wait((unique_lock *)&this->cv);
  }
  this->done = false;
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void InterruptDoneSignalState::Await() {
	std::unique_lock<std::mutex> lck(lock);
	cv.wait(lck, [&]() { return done; });

	// Reset after signal received
	done = false;
}